

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

float64 propagateFloat64NaN(float64 a,float64 b,float_status *status)

{
  _Bool _Var1;
  int iVar2;
  FloatClass local_4c;
  FloatClass local_48;
  FloatClass b_cls;
  FloatClass a_cls;
  uint64_t bv;
  uint64_t av;
  flag aIsLargerSignificand;
  float_status *status_local;
  float64 b_local;
  float64 a_local;
  
  iVar2 = float64_is_any_nan(a);
  if (iVar2 == 0) {
    local_48 = float_class_normal;
  }
  else {
    iVar2 = float64_is_signaling_nan_tricore(a,status);
    local_48 = float_class_qnan;
    if (iVar2 != 0) {
      local_48 = float_class_snan;
    }
  }
  iVar2 = float64_is_any_nan(b);
  if (iVar2 == 0) {
    local_4c = float_class_normal;
  }
  else {
    iVar2 = float64_is_signaling_nan_tricore(b,status);
    local_4c = float_class_qnan;
    if (iVar2 != 0) {
      local_4c = float_class_snan;
    }
  }
  _Var1 = is_snan(local_48);
  if ((_Var1) || (_Var1 = is_snan(local_4c), _Var1)) {
    float_raise_tricore('\x01',status);
  }
  if (status->default_nan_mode == '\0') {
    if (a << 1 < b << 1) {
      av._7_1_ = false;
    }
    else if (b << 1 < a << 1) {
      av._7_1_ = true;
    }
    else {
      av._7_1_ = a < b;
    }
    iVar2 = pickNaN(local_48,local_4c,av._7_1_);
    if (iVar2 == 0) {
      _Var1 = is_snan(local_48);
      a_local = a;
      if (_Var1) {
        a_local = float64_silence_nan_tricore(a,status);
      }
    }
    else {
      _Var1 = is_snan(local_4c);
      a_local = b;
      if (_Var1) {
        a_local = float64_silence_nan_tricore(b,status);
      }
    }
  }
  else {
    a_local = float64_default_nan_tricore(status);
  }
  return a_local;
}

Assistant:

static float64 propagateFloat64NaN(float64 a, float64 b, float_status *status)
{
    flag aIsLargerSignificand;
    uint64_t av, bv;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!float64_is_any_nan(a)
             ? float_class_normal
             : float64_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!float64_is_any_nan(b)
             ? float_class_normal
             : float64_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    av = float64_val(a);
    bv = float64_val(b);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return float64_default_nan(status);
    }

    if ((uint64_t)(av << 1) < (uint64_t)(bv << 1)) {
        aIsLargerSignificand = 0;
    } else if ((uint64_t)(bv << 1) < (uint64_t)(av << 1)) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (av < bv) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return float64_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return float64_silence_nan(a, status);
        }
        return a;
    }
}